

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall diligent_spirv_cross::Compiler::register_write(Compiler *this,uint32_t chain)

{
  Variant *pVVar1;
  Parameter *pPVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRVariable *var;
  SPIRType *pSVar5;
  SPIRType *pSVar6;
  SPIRExpression *pSVar7;
  ulong uVar8;
  SPIRAccessChain *pSVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar10 = (ulong)chain;
  if ((uVar10 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar1[uVar10].type == TypeVariable)) {
    var = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar1 + uVar10);
  }
  else {
    var = (SPIRVariable *)0x0;
  }
  if (var == (SPIRVariable *)0x0) {
    if ((uVar10 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
       (pVVar1 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
       pVVar1[uVar10].type == TypeExpression)) {
      pSVar7 = Variant::get<diligent_spirv_cross::SPIRExpression>(pVVar1 + uVar10);
    }
    else {
      pSVar7 = (SPIRExpression *)0x0;
    }
    if ((((pSVar7 == (SPIRExpression *)0x0) || (uVar8 = (ulong)(pSVar7->loaded_from).id, uVar8 == 0)
         ) || ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size <= uVar8))
       || (pVVar1 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
          pVVar1[uVar8].type != TypeVariable)) {
      var = (SPIRVariable *)0x0;
    }
    else {
      var = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar1 + uVar8);
    }
    if ((uVar10 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
       (pVVar1 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
       pVVar1[uVar10].type == TypeAccessChain)) {
      pSVar9 = Variant::get<diligent_spirv_cross::SPIRAccessChain>(pVVar1 + uVar10);
    }
    else {
      pSVar9 = (SPIRAccessChain *)0x0;
    }
    if ((pSVar9 != (SPIRAccessChain *)0x0) &&
       (uVar10 = (ulong)*(uint *)(pSVar9 + 0x5c), uVar10 != 0)) {
      if ((uVar10 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
         (pVVar1 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar1[uVar10].type == TypeVariable)) {
        var = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar1 + uVar10);
      }
      else {
        var = (SPIRVariable *)0x0;
      }
    }
  }
  uVar4 = expression_type_id(this,chain);
  pSVar5 = Variant::get<diligent_spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + uVar4);
  if (var != (SPIRVariable *)0x0) {
    uVar4 = expression_type_id(this,chain);
    pSVar5 = Variant::get<diligent_spirv_cross::SPIRType>
                       ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + uVar4);
    pSVar6 = get_variable_data_type(this,var);
    bVar11 = true;
    if (pSVar6->pointer == true) {
      flush_all_active_variables(this);
      bVar11 = pSVar5->pointer_depth != 1;
    }
    if ((pSVar5->storage == PhysicalStorageBuffer) ||
       (bVar3 = variable_storage_is_aliased(this,var), bVar3)) {
      flush_all_aliased_variables(this);
    }
    else {
      flush_dependees(this,var);
    }
    if (((bVar11) && (pPVar2 = var->parameter, pPVar2 != (Parameter *)0x0)) &&
       (pPVar2->write_count == 0)) {
      pPVar2->write_count = 1;
      this->is_force_recompile = true;
    }
    return;
  }
  if (pSVar5->pointer != true) {
    return;
  }
  flush_all_active_variables(this);
  return;
}

Assistant:

void Compiler::register_write(uint32_t chain)
{
	auto *var = maybe_get<SPIRVariable>(chain);
	if (!var)
	{
		// If we're storing through an access chain, invalidate the backing variable instead.
		auto *expr = maybe_get<SPIRExpression>(chain);
		if (expr && expr->loaded_from)
			var = maybe_get<SPIRVariable>(expr->loaded_from);

		auto *access_chain = maybe_get<SPIRAccessChain>(chain);
		if (access_chain && access_chain->loaded_from)
			var = maybe_get<SPIRVariable>(access_chain->loaded_from);
	}

	auto &chain_type = expression_type(chain);

	if (var)
	{
		bool check_argument_storage_qualifier = true;
		auto &type = expression_type(chain);

		// If our variable is in a storage class which can alias with other buffers,
		// invalidate all variables which depend on aliased variables. And if this is a
		// variable pointer, then invalidate all variables regardless.
		if (get_variable_data_type(*var).pointer)
		{
			flush_all_active_variables();

			if (type.pointer_depth == 1)
			{
				// We have a backing variable which is a pointer-to-pointer type.
				// We are storing some data through a pointer acquired through that variable,
				// but we are not writing to the value of the variable itself,
				// i.e., we are not modifying the pointer directly.
				// If we are storing a non-pointer type (pointer_depth == 1),
				// we know that we are storing some unrelated data.
				// A case here would be
				// void foo(Foo * const *arg) {
				//   Foo *bar = *arg;
				//   bar->unrelated = 42;
				// }
				// arg, the argument is constant.
				check_argument_storage_qualifier = false;
			}
		}

		if (type.storage == StorageClassPhysicalStorageBufferEXT || variable_storage_is_aliased(*var))
			flush_all_aliased_variables();
		else if (var)
			flush_dependees(*var);

		// We tried to write to a parameter which is not marked with out qualifier, force a recompile.
		if (check_argument_storage_qualifier && var->parameter && var->parameter->write_count == 0)
		{
			var->parameter->write_count++;
			force_recompile();
		}
	}
	else if (chain_type.pointer)
	{
		// If we stored through a variable pointer, then we don't know which
		// variable we stored to. So *all* expressions after this point need to
		// be invalidated.
		// FIXME: If we can prove that the variable pointer will point to
		// only certain variables, we can invalidate only those.
		flush_all_active_variables();
	}

	// If chain_type.pointer is false, we're not writing to memory backed variables, but temporaries instead.
	// This can happen in copy_logical_type where we unroll complex reads and writes to temporaries.
}